

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_distance.cpp
# Opt level: O3

size_type pstore::command_line::string_distance(string *from,string *to,size_type max_edit_distance)

{
  size_t n;
  ulong uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  undefined1 auVar4 [16];
  unsigned_long *puVar5;
  ulong uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  size_t n_00;
  unsigned_long uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  small_vector<unsigned_long,_64UL> column;
  small_vector<unsigned_long,_64UL> local_258;
  long lVar14;
  
  n = from->_M_string_length;
  uVar1 = to->_M_string_length;
  small_vector<unsigned_long,_64UL>::small_vector(&local_258,n + 1);
  auVar4 = _DAT_00127080;
  if (local_258.elements_ != 0) {
    uVar6 = local_258.elements_ + 0x1fffffffffffffff & 0x1fffffffffffffff;
    auVar12._8_4_ = (int)uVar6;
    auVar12._0_8_ = uVar6;
    auVar12._12_4_ = (int)(uVar6 >> 0x20);
    uVar7 = 0;
    auVar12 = auVar12 ^ _DAT_00127080;
    auVar13 = _DAT_00127070;
    do {
      auVar15 = auVar13 ^ auVar4;
      if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                  auVar12._4_4_ < auVar15._4_4_) & 1)) {
        local_258.buffer_[uVar7] = uVar7;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        local_258.buffer_[uVar7 + 1] = uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar14 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar14 + 2;
    } while ((uVar6 - ((uint)(local_258.elements_ + 0x1fffffffffffffff) & 1)) + 2 != uVar7);
  }
  if (uVar1 != 0) {
    uVar7 = max_edit_distance + 1;
    uVar11 = 1;
    do {
      puVar5 = small_vector<unsigned_long,64ul>::
               index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,0);
      *puVar5 = uVar11;
      uVar6 = uVar11;
      if (n != 0) {
        n_00 = 1;
        uVar10 = uVar11 - 1;
        do {
          puVar5 = small_vector<unsigned_long,64ul>::
                   index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,n_00);
          uVar2 = *puVar5;
          puVar5 = small_vector<unsigned_long,64ul>::
                   index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,n_00);
          uVar3 = *puVar5;
          puVar5 = small_vector<unsigned_long,64ul>::
                   index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>
                             (&local_258,n_00 - 1);
          uVar8 = ((from->_M_dataplus)._M_p[n_00 - 1] != (to->_M_dataplus)._M_p[uVar11 - 1]) +
                  uVar10;
          uVar9 = *puVar5 + 1;
          if (uVar3 + 1 <= *puVar5 + 1) {
            uVar9 = uVar3 + 1;
          }
          if (uVar8 < uVar9) {
            uVar9 = uVar8;
          }
          puVar5 = small_vector<unsigned_long,64ul>::
                   index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,n_00);
          *puVar5 = uVar9;
          puVar5 = small_vector<unsigned_long,64ul>::
                   index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,n_00);
          if (*puVar5 < uVar6) {
            uVar6 = *puVar5;
          }
          n_00 = n_00 + 1;
          uVar10 = uVar2;
        } while (n_00 <= n);
      }
      if ((max_edit_distance != 0) && (max_edit_distance < uVar6)) goto LAB_0011c328;
      uVar11 = uVar11 + 1;
    } while (uVar11 <= uVar1);
  }
  puVar5 = small_vector<unsigned_long,64ul>::
           index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,n);
  uVar7 = *puVar5;
LAB_0011c328:
  if (local_258.big_buffer_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.big_buffer_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.big_buffer_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.big_buffer_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar7;
}

Assistant:

std::string::size_type string_distance (std::string const & from, std::string const & to,
                                                std::string::size_type const max_edit_distance) {
            using size_type = std::string::size_type;

            size_type const m = from.size ();
            size_type const n = to.size ();

            small_vector<size_type, 64> column (m + 1U);
            std::iota (std::begin (column), std::end (column), size_type{0});
            constexpr auto column_start = size_type{1};

            for (auto x = column_start; x <= n; x++) {
                column[0] = x;
                auto best_this_column = x;
                auto last_diagonal = x - column_start;
                for (auto y = column_start; y <= m; y++) {
                    auto const old_diagonal = column[y];
                    column[y] = std::min ({column[y] + 1U, column[y - 1U] + 1U,
                                           last_diagonal + (from[y - 1U] == to[x - 1U] ? 0U : 1U)});
                    last_diagonal = old_diagonal;
                    best_this_column = std::min (best_this_column, column[y]);
                }
                if (max_edit_distance != 0 && best_this_column > max_edit_distance) {
                    return max_edit_distance + 1U;
                }
            }
            return column[m];
        }